

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeParameterIndex(Vdbe *p,char *zName,int nName)

{
  char *__s1;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  if (zName != (char *)0x0 && p != (Vdbe *)0x0) {
    uVar1 = (uint)(ushort)p->nzVar;
    if (p->nzVar < 1) {
      uVar1 = 0;
    }
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      __s1 = p->azVar[uVar3];
      if (((__s1 != (char *)0x0) && (iVar2 = strncmp(__s1,zName,(long)nName), iVar2 == 0)) &&
         (__s1[nName] == '\0')) {
        return (int)uVar3 + 1;
      }
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeParameterIndex(Vdbe *p, const char *zName, int nName){
  int i;
  if( p==0 ){
    return 0;
  }
  if( zName ){
    for(i=0; i<p->nzVar; i++){
      const char *z = p->azVar[i];
      if( z && strncmp(z,zName,nName)==0 && z[nName]==0 ){
        return i+1;
      }
    }
  }
  return 0;
}